

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

Vec_Int_t * Gia_ManProcessOutputs(Vec_Ptr_t *vCexesIn,Vec_Ptr_t *vCexesOut,Vec_Int_t *vOutMap)

{
  uint uVar1;
  int i;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int *__ptr;
  uint uVar4;
  char *__assertion;
  int i_00;
  long lVar5;
  
  if (vCexesIn->nSize == vOutMap->nSize) {
    pVVar2 = Vec_IntAlloc(vCexesIn->nSize);
    i_00 = 0;
    while( true ) {
      if (vOutMap->nSize <= i_00) {
        if (pVVar2->nSize <= vOutMap->nSize) {
          vOutMap->nSize = pVVar2->nSize;
          return pVVar2;
        }
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      i = Vec_IntEntry(vOutMap,i_00);
      pvVar3 = Vec_PtrEntry(vCexesOut,i);
      if (pvVar3 != (void *)0x0) break;
      pvVar3 = Vec_PtrEntry(vCexesIn,i_00);
      if (pvVar3 == (void *)0x0) {
        uVar1 = pVVar2->nSize;
        lVar5 = (long)(int)uVar1;
        if ((lVar5 < 0) || (vOutMap->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vOutMap->pArray[lVar5] = i;
        if (uVar1 == pVVar2->nCap) {
          uVar4 = uVar1 * 2;
          if (uVar1 < 0x10) {
            uVar4 = 0x10;
          }
          __ptr = pVVar2->pArray;
          if ((int)uVar1 < (int)uVar4) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc((ulong)uVar4 << 2);
            }
            else {
              __ptr = (int *)realloc(__ptr,(ulong)uVar4 << 2);
            }
            pVVar2->pArray = __ptr;
            if (__ptr == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar2->nCap = uVar4;
          }
        }
        else {
          __ptr = pVVar2->pArray;
        }
        pVVar2->nSize = uVar1 + 1;
        __ptr[lVar5] = i_00;
      }
      else {
        Vec_PtrWriteEntry(vCexesIn,i_00,(void *)0x0);
        Vec_PtrWriteEntry(vCexesOut,i,pvVar3);
      }
      i_00 = i_00 + 1;
    }
    __assertion = "Vec_PtrEntry(vCexesOut, iOut) == NULL";
    uVar1 = 0x3b;
  }
  else {
    __assertion = "Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap)";
    uVar1 = 0x37;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMulti.c"
                ,uVar1,"Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Divides outputs into solved and unsolved.]

  Description [Return array of unsolved outputs to extract into a new AIG.
  Updates the resulting CEXes (vCexesOut) and current output map (vOutMap).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManProcessOutputs( Vec_Ptr_t * vCexesIn, Vec_Ptr_t * vCexesOut, Vec_Int_t * vOutMap )
{
    Abc_Cex_t * pCex; 
    Vec_Int_t * vLeftOver;
    int i, iOut;
    assert( Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap) );
    vLeftOver = Vec_IntAlloc( Vec_PtrSize(vCexesIn) );
    Vec_IntForEachEntry( vOutMap, iOut, i )
    {
        assert( Vec_PtrEntry(vCexesOut, iOut) == NULL );
        pCex = (Abc_Cex_t *)Vec_PtrEntry( vCexesIn, i );
        if ( pCex ) // found a CEX for output iOut
        {
            Vec_PtrWriteEntry( vCexesIn, i, NULL );
            Vec_PtrWriteEntry( vCexesOut, iOut, pCex );
        }
        else // still unsolved
        {
            Vec_IntWriteEntry( vOutMap, Vec_IntSize(vLeftOver), iOut );
            Vec_IntPush( vLeftOver, i );
        }
    }
    Vec_IntShrink( vOutMap, Vec_IntSize(vLeftOver) );
    return vLeftOver;
}